

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioContextDemuxer.cpp
# Opt level: O2

int __thiscall IOContextDemuxer::get_byte(IOContextDemuxer *this)

{
  int iVar1;
  undefined4 extraout_var;
  byte *pbVar2;
  int readRez;
  uint32_t readedBytes;
  undefined8 local_28;
  
  local_28 = 0;
  pbVar2 = this->m_curPos;
  if (pbVar2 == this->m_bufEnd) {
    iVar1 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                      (this->m_bufferedReader,(ulong)(uint)this->m_readerID,(long)&local_28 + 4,
                       &local_28,0);
    if ((int)local_28 == 0 && local_28._4_4_ != 0) {
      (*this->m_bufferedReader->_vptr_AbstractReader[5])
                (this->m_bufferedReader,(ulong)(uint)this->m_readerID);
    }
    this->m_lastReadRez = (int)local_28;
    pbVar2 = (byte *)(CONCAT44(extraout_var,iVar1) + 0xbc);
    this->m_curPos = pbVar2;
    this->m_bufEnd = (uint8_t *)((ulong)local_28._4_4_ + 0xbc + CONCAT44(extraout_var,iVar1));
    if (local_28._4_4_ == 0) {
      this->m_isEOF = true;
      return 0;
    }
  }
  this->m_processedBytes = this->m_processedBytes + 1;
  this->m_curPos = pbVar2 + 1;
  return (uint)*pbVar2;
}

Assistant:

int IOContextDemuxer::get_byte()
{
    uint32_t readedBytes = 0;
    int readRez = 0;
    if (m_curPos == m_bufEnd)
    {
        uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez);  // blocked read mode
        if (readedBytes > 0 && readRez == 0)
            m_bufferedReader->notify(m_readerID, readedBytes);
        m_lastReadRez = readRez;
        m_curPos = data + 188;
        m_bufEnd = m_curPos + readedBytes;
        if (m_curPos == m_bufEnd)
        {
            m_isEOF = true;
            return 0;
        }
    }
    m_processedBytes++;
    return *m_curPos++;
}